

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string_base<allocator_default<char>_> * __thiscall
string_base<allocator_default<char>_>::operator=
          (string_base<allocator_default<char>_> *this,char *other)

{
  uint uVar1;
  
  free(this,other);
  if (other != (char *)0x0) {
    uVar1 = str_length(other);
    copy(this,(EVP_PKEY_CTX *)other,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  return this;
}

Assistant:

string_base &operator = (const char *other)
	{
		free();
		if(other)
			copy(other, str_length(other));
		return *this;
	}